

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void nn_pipebase_getopt(nn_pipebase *self,int level,int option,void *optval,size_t *optvallen)

{
  FILE *pFVar1;
  char *pcVar2;
  void *in_RCX;
  uint in_EDX;
  int in_ESI;
  void *in_RDI;
  ulong *in_R8;
  int unaff_retaddr;
  int unaff_retaddr_00;
  nn_sock *in_stack_00000008;
  int intval;
  int rc;
  int in_stack_ffffffffffffffac;
  size_t local_48;
  undefined4 local_28;
  int local_24;
  ulong *local_20;
  
  if (in_ESI == 0) {
    if (in_EDX == 8) {
      local_28 = *(undefined4 *)((long)in_RDI + 200);
    }
    else if (in_EDX == 9) {
      local_28 = *(undefined4 *)((long)in_RDI + 0xcc);
    }
    else {
      if (in_EDX != 0xe) {
        local_24 = nn_sock_getopt_inner
                             (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_RDI,
                              (size_t *)(ulong)in_EDX);
        if (local_24 == 0) {
          return;
        }
        nn_backtrace_print();
        pFVar1 = _stderr;
        pcVar2 = nn_err_strerror(in_stack_ffffffffffffffac);
        fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-local_24,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/pipe.c"
                ,0x93);
        fflush(_stderr);
        nn_err_abort();
      }
      local_28 = *(undefined4 *)((long)in_RDI + 0xd0);
    }
    if (*in_R8 < 4) {
      local_48 = *in_R8;
    }
    else {
      local_48 = 4;
    }
    local_20 = in_R8;
    memcpy(in_RCX,&local_28,local_48);
    *local_20 = 4;
  }
  else {
    local_24 = nn_sock_getopt_inner
                         (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_RDI,
                          (size_t *)CONCAT44(in_ESI,in_EDX));
    if (local_24 != 0) {
      nn_backtrace_print();
      pFVar1 = _stderr;
      pcVar2 = nn_err_strerror(in_stack_ffffffffffffffac);
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-local_24,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/pipe.c"
              ,0x9f);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  return;
}

Assistant:

void nn_pipebase_getopt (struct nn_pipebase *self, int level, int option,
    void *optval, size_t *optvallen)
{
    int rc;
    int intval;

    if (level == NN_SOL_SOCKET) {
        switch (option) {

        /*  Endpoint options  */
        case NN_SNDPRIO:
            intval = self->options.sndprio;
            break;
        case NN_RCVPRIO:
            intval = self->options.rcvprio;
            break;
        case NN_IPV4ONLY:
            intval = self->options.ipv4only;
            break;

        /*  Fallback to socket options  */
        default:
            rc = nn_sock_getopt_inner (self->sock, level,
                option, optval, optvallen);
            errnum_assert (rc == 0, -rc);
            return;
        }

        memcpy (optval, &intval,
            *optvallen < sizeof (int) ? *optvallen : sizeof (int));
        *optvallen = sizeof (int);

        return;
    }

    rc = nn_sock_getopt_inner (self->sock, level, option, optval, optvallen);
    errnum_assert (rc == 0, -rc);
}